

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderRelaxNGSetSchema(xmlTextReaderPtr reader,xmlRelaxNGPtr schema)

{
  xmlRelaxNGValidCtxtPtr ctxt;
  undefined4 uVar1;
  long lVar2;
  xmlRelaxNGValidCtxtPtr *ppxVar3;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  if (schema == (xmlRelaxNGPtr)0x0) {
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
    if (reader->rngValidCtxt == (xmlRelaxNGValidCtxtPtr)0x0) {
      uVar1 = 0;
      lVar2 = 0xe0;
      goto LAB_0016f97f;
    }
    ppxVar3 = &reader->rngValidCtxt;
    lVar2 = 0xe0;
    uVar1 = 0;
    if (reader->rngPreserveCtxt == 0) {
      xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
      uVar1 = 0;
    }
  }
  else {
    if (reader->mode != 0) {
      return -1;
    }
    if (reader->rngSchemas != (xmlRelaxNGPtr)0x0) {
      xmlRelaxNGFree(reader->rngSchemas);
      reader->rngSchemas = (xmlRelaxNGPtr)0x0;
    }
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      if (reader->rngPreserveCtxt == 0) {
        xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
      }
      reader->rngValidCtxt = (xmlRelaxNGValidCtxtPtr)0x0;
    }
    reader->rngPreserveCtxt = 0;
    ctxt = xmlRelaxNGNewValidCtxt(schema);
    reader->rngValidCtxt = ctxt;
    if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
      return -1;
    }
    if ((reader->errorFunc != (xmlTextReaderErrorFunc)0x0) ||
       (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0)) {
      xmlRelaxNGSetValidStructuredErrors(ctxt,xmlTextReaderStructuredRelay,reader);
    }
    reader->rngValidErrors = 0;
    ppxVar3 = (xmlRelaxNGValidCtxtPtr *)&reader->rngFullNode;
    lVar2 = 0x10;
    uVar1 = 2;
  }
  *ppxVar3 = (xmlRelaxNGValidCtxtPtr)0x0;
LAB_0016f97f:
  *(undefined4 *)((long)&reader->mode + lVar2) = uVar1;
  return 0;
}

Assistant:

int
xmlTextReaderRelaxNGSetSchema(xmlTextReaderPtr reader, xmlRelaxNGPtr schema) {
    if (reader == NULL)
        return(-1);
    if (schema == NULL) {
        if (reader->rngSchemas != NULL) {
	    xmlRelaxNGFree(reader->rngSchemas);
	    reader->rngSchemas = NULL;
	}
        if (reader->rngValidCtxt != NULL) {
	    if (! reader->rngPreserveCtxt)
		xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
	    reader->rngValidCtxt = NULL;
        }
	reader->rngPreserveCtxt = 0;
	return(0);
    }
    if (reader->mode != XML_TEXTREADER_MODE_INITIAL)
	return(-1);
    if (reader->rngSchemas != NULL) {
	xmlRelaxNGFree(reader->rngSchemas);
	reader->rngSchemas = NULL;
    }
    if (reader->rngValidCtxt != NULL) {
	if (! reader->rngPreserveCtxt)
	    xmlRelaxNGFreeValidCtxt(reader->rngValidCtxt);
	reader->rngValidCtxt = NULL;
    }
    reader->rngPreserveCtxt = 0;
    reader->rngValidCtxt = xmlRelaxNGNewValidCtxt(schema);
    if (reader->rngValidCtxt == NULL)
        return(-1);
    if ((reader->errorFunc != NULL) || (reader->sErrorFunc != NULL))
	xmlRelaxNGSetValidStructuredErrors(reader->rngValidCtxt,
			xmlTextReaderStructuredRelay, reader);
    reader->rngValidErrors = 0;
    reader->rngFullNode = NULL;
    reader->validate = XML_TEXTREADER_VALIDATE_RNG;
    return(0);
}